

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

bool fmt::v5::internal::grisu2_round
               (char *buf,int *size,int max_digits,uint64_t delta,uint64_t remainder,uint64_t exp,
               uint64_t diff,int *exp10)

{
  bool bVar1;
  uint64_t exp_local;
  uint64_t remainder_local;
  uint64_t delta_local;
  int max_digits_local;
  int *size_local;
  char *buf_local;
  
  remainder_local = remainder;
  while( true ) {
    bVar1 = false;
    if (((remainder_local < diff) && (bVar1 = false, exp <= delta - remainder_local)) &&
       (bVar1 = true, diff <= remainder_local + exp)) {
      bVar1 = (remainder_local + exp) - diff < diff - remainder_local;
    }
    if (!bVar1) break;
    buf[*size + -1] = buf[*size + -1] + -1;
    remainder_local = exp + remainder_local;
  }
  if (max_digits < *size) {
    *size = *size + -1;
    *exp10 = *exp10 + 1;
    if ('4' < buf[*size]) {
      return false;
    }
  }
  return true;
}

Assistant:

FMT_FUNC bool grisu2_round(
    char *buf, int &size, int max_digits, uint64_t delta,
    uint64_t remainder, uint64_t exp, uint64_t diff, int &exp10) {
  while (remainder < diff && delta - remainder >= exp &&
        (remainder + exp < diff || diff - remainder > remainder + exp - diff)) {
    --buf[size - 1];
    remainder += exp;
  }
  if (size > max_digits) {
    --size;
    ++exp10;
    if (buf[size] >= '5')
      return false;
  }
  return true;
}